

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog_util.c
# Opt level: O2

int full_write(file_stream *strm,void *buf,size_t count)

{
  ssize_t sVar1;
  size_t __n;
  
  while( true ) {
    if (count == 0) {
      return 0;
    }
    __n = 0x7fffffff;
    if (count < 0x7fffffff) {
      __n = count;
    }
    sVar1 = write(strm->fd,buf,__n);
    if (sVar1 < 1) break;
    buf = (void *)((long)buf + sVar1);
    count = count - sVar1;
  }
  msg_errno("Error writing to %s",strm->name);
  return -1;
}

Assistant:

int
full_write(struct file_stream *strm, const void *buf, size_t count)
{
	const char *p = buf;

	while (count != 0) {
		ssize_t res = write(strm->fd, p, MIN(count, INT_MAX));
		if (res <= 0) {
			msg_errno("Error writing to %"TS, strm->name);
			return -1;
		}
		p += res;
		count -= res;
	}
	return 0;
}